

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O3

bool __thiscall YAML::Stream::_ReadAheadTo(Stream *this,size_t i)

{
  int iVar1;
  long lVar2;
  _Elt_pointer pcVar3;
  _Map_pointer ppcVar4;
  _Elt_pointer pcVar5;
  char local_19;
  
  iVar1 = *(int *)(this->m_input + *(long *)(*(long *)this->m_input + -0x18) + 0x20);
  while (iVar1 == 0) {
    ppcVar4 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    lVar2 = (long)ppcVar4 -
            (long)(this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node >> 3;
    pcVar3 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_last +
             ((long)(this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur -
             (long)(this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_first);
    pcVar5 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    if (i < pcVar3 + ((lVar2 + -1 + (ulong)(ppcVar4 == (_Map_pointer)0x0)) * 0x200 - (long)pcVar5))
    goto LAB_0071b3b2;
    switch(this->m_charSet) {
    case utf8:
      StreamInUtf8(this);
      break;
    case utf16le:
    case utf16be:
      StreamInUtf16(this);
      break;
    case utf32le:
    case utf32be:
      StreamInUtf32(this);
    }
    iVar1 = *(int *)(this->m_input + *(long *)(*(long *)this->m_input + -0x18) + 0x20);
  }
  local_19 = '\x04';
  pcVar5 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pcVar5 == (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<char,_std::allocator<char>_>::_M_push_back_aux<char>(&this->m_readahead,&local_19);
    pcVar3 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  }
  else {
    *pcVar5 = '\x04';
    pcVar3 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur + 1;
    (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = pcVar3;
  }
  pcVar5 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  ppcVar4 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  lVar2 = (long)ppcVar4 -
          (long)(this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                super__Deque_impl_data._M_start._M_node >> 3;
  pcVar3 = (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
           super__Deque_impl_data._M_start._M_last +
           ((long)pcVar3 -
           (long)(this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_first);
LAB_0071b3b2:
  return i < pcVar3 + ((lVar2 + -1 + (ulong)(ppcVar4 == (_Map_pointer)0x0)) * 0x200 - (long)pcVar5);
}

Assistant:

bool Stream::_ReadAheadTo(size_t i) const {
  while (m_input.good() && (m_readahead.size() <= i)) {
    switch (m_charSet) {
      case utf8:
        StreamInUtf8();
        break;
      case utf16le:
        StreamInUtf16();
        break;
      case utf16be:
        StreamInUtf16();
        break;
      case utf32le:
        StreamInUtf32();
        break;
      case utf32be:
        StreamInUtf32();
        break;
    }
  }

  // signal end of stream
  if (!m_input.good())
    m_readahead.push_back(Stream::eof());

  return m_readahead.size() > i;
}